

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N)

{
  byte bVar1;
  byte bVar2;
  u32 uVar3;
  uint *puVar4;
  bool bVar5;
  int iVar6;
  u32 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  DbPage *pOvflPage;
  DbPage *local_40;
  ulong local_38;
  
  uVar9 = iPage;
  uVar11 = N;
  while( true ) {
    if ((int)uVar11 < 1) {
      return;
    }
    if (pCheck->mxErr == 0) break;
    uVar12 = uVar11 - 1;
    if ((int)uVar9 < 1) {
      bVar5 = false;
      checkAppendMsg(pCheck,"%d of %d pages missing from overflow list starting at %d",(ulong)uVar11
                     ,(ulong)(uint)N,(ulong)(uint)iPage);
      uVar11 = uVar12;
    }
    else {
      iVar6 = checkRef(pCheck,uVar9);
      if (iVar6 == 0) {
        iVar6 = (*pCheck->pPager->xGet)(pCheck->pPager,uVar9,&local_40,0);
        if (iVar6 == 0) {
          puVar4 = (uint *)local_40->pData;
          if (isFreeList == 0) {
            if ((uVar11 != 1) && (pCheck->pBt->autoVacuum != '\0')) {
              uVar11 = *puVar4;
              checkPtrmap(pCheck,uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8
                                 | uVar11 << 0x18,'\x04',uVar9);
            }
          }
          else {
            uVar8 = puVar4[1];
            uVar10 = (uint)*(byte *)((long)puVar4 + 5);
            bVar1 = *(byte *)((long)puVar4 + 6);
            bVar2 = *(byte *)((long)puVar4 + 7);
            if (pCheck->pBt->autoVacuum != '\0') {
              local_38 = (ulong)*(byte *)((long)puVar4 + 5);
              checkPtrmap(pCheck,uVar9,'\x02',0);
              uVar10 = (uint)local_38;
            }
            iVar6 = (uint)(byte)uVar8 * 0x1000000;
            uVar14 = (uint)bVar1 * 0x100;
            uVar8 = uVar10 * 0x10000 + iVar6 | uVar14 | (uint)bVar2;
            uVar3 = pCheck->pBt->usableSize;
            uVar7 = uVar3 + 3;
            if (-1 < (int)uVar3) {
              uVar7 = uVar3;
            }
            if (((int)uVar7 >> 2) + -2 < (int)uVar8) {
              checkAppendMsg(pCheck,"freelist leaf count too big on page %d",(ulong)uVar9);
              uVar12 = uVar11 - 2;
            }
            else {
              if (0 < (int)uVar8) {
                uVar13 = 0;
                do {
                  uVar9 = puVar4[uVar13 + 2];
                  uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                          uVar9 << 0x18;
                  if (pCheck->pBt->autoVacuum != '\0') {
                    checkPtrmap(pCheck,uVar9,'\x02',0);
                  }
                  checkRef(pCheck,uVar9);
                  uVar13 = uVar13 + 1;
                } while (uVar14 + bVar2 + iVar6 + uVar10 * 0x10000 != uVar13);
              }
              uVar12 = uVar12 - uVar8;
            }
          }
          uVar9 = *puVar4;
          if (local_40 != (DbPage *)0x0) {
            sqlite3PagerUnrefNotNull(local_40);
          }
          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          bVar5 = true;
          uVar11 = uVar12;
          if ((isFreeList != 0) && ((int)uVar12 < (int)(uint)(uVar9 != 0))) {
            checkAppendMsg(pCheck,"free-page count in header is too small");
          }
        }
        else {
          bVar5 = false;
          checkAppendMsg(pCheck,"failed to get page %d",(ulong)uVar9);
          uVar11 = uVar12;
        }
      }
      else {
        bVar5 = false;
        uVar11 = uVar12;
      }
    }
    if (!bVar5) {
      return;
    }
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N                 /* Expected number of pages in the list */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);

    if( isFreeList && N<(iPage!=0) ){
      checkAppendMsg(pCheck, "free-page count in header is too small");
    }
  }
}